

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::AggressiveDCEPass::IsEntryPoint(AggressiveDCEPass *this,Function *func)

{
  Module *pMVar1;
  Instruction *this_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_01;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  Instruction *entry_point;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_00 = *(Instruction **)
             ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  while( true ) {
    bVar2 = this_00 !=
            (Instruction *)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
    if (!bVar2) {
      return bVar2;
    }
    uVar5 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar5 = (uint)this_00->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(this_00,uVar5 + 1);
    this_01._M_head_impl =
         (func->def_inst_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar4 = 0;
    if ((this_01._M_head_impl)->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand
                        (this_01._M_head_impl,(uint)(this_01._M_head_impl)->has_type_id_);
    }
    if (uVar3 == uVar4) break;
    this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return bVar2;
}

Assistant:

bool AggressiveDCEPass::IsVarOfStorage(uint32_t varId,
                                       spv::StorageClass storageClass) {
  if (varId == 0) return false;
  const Instruction* varInst = get_def_use_mgr()->GetDef(varId);
  const spv::Op op = varInst->opcode();
  if (op != spv::Op::OpVariable) return false;
  const uint32_t varTypeId = varInst->type_id();
  const Instruction* varTypeInst = get_def_use_mgr()->GetDef(varTypeId);
  if (varTypeInst->opcode() != spv::Op::OpTypePointer) return false;
  return spv::StorageClass(varTypeInst->GetSingleWordInOperand(
             kTypePointerStorageClassInIdx)) == storageClass;
}